

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_tuple_management.hpp
# Opt level: O1

void burst::management::manage<burst::dynamic_tuple>
               (operation_t todo,void *source,void *destination)

{
  switch(todo) {
  case copy:
    burst::dynamic_tuple::dynamic_tuple((dynamic_tuple *)destination,(dynamic_tuple *)source);
    return;
  case move:
    *(undefined8 *)((long)destination + 0x20) = 0;
    *(undefined8 *)((long)destination + 0x28) = 0;
    *(undefined8 *)((long)destination + 0x10) = 0;
    *(undefined8 *)((long)destination + 0x18) = 0;
    *(undefined8 *)destination = 0;
    *(undefined8 *)((long)destination + 8) = 0;
    burst::dynamic_tuple::swap((dynamic_tuple *)destination,(dynamic_tuple *)source);
    return;
  case destroy:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x56,
                    "void burst::management::manage(operation_t, const void *, void *) [T = burst::dynamic_tuple]"
                   );
    }
    burst::dynamic_tuple::~dynamic_tuple((dynamic_tuple *)destination);
    return;
  case size:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x5c,
                    "void burst::management::manage(operation_t, const void *, void *) [T = burst::dynamic_tuple]"
                   );
    }
    *(undefined8 *)destination = 0x30;
    break;
  case type:
    if (source != (void *)0x0) {
      __assert_fail("source == nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/detail/dynamic_tuple_management.hpp"
                    ,0x62,
                    "void burst::management::manage(operation_t, const void *, void *) [T = burst::dynamic_tuple]"
                   );
    }
    *(pointer_____offset_0x10___ **)destination = &burst::dynamic_tuple::typeinfo;
  }
  return;
}

Assistant:

void manage (operation_t todo, const void * source, void * destination)
        {
            switch (todo)
            {
                case operation_t::copy:
                {
                    copy<T>(source, destination);
                    break;
                }
                case operation_t::move:
                {
                    move<T>(const_cast<void *>(source), destination);
                    break;
                }
                case operation_t::destroy:
                {
                    assert(source == nullptr);
                    destroy<T>(destination);
                    break;
                }
                case operation_t::size:
                {
                    assert(source == nullptr);
                    *static_cast<std::size_t *>(destination) = sizeof(T);
                    break;
                }
                case operation_t::type:
                {
                    assert(source == nullptr);
                    *static_cast<const std::type_info **>(destination) = std::addressof(typeid(T));
                    break;
                }
            }
        }